

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk__draw_list_begin(nk_draw_list *canvas,nk_buffer *buffer)

{
  nk_draw_command *cmd;
  nk_size offset;
  nk_byte *memory;
  nk_buffer *buffer_local;
  nk_draw_list *canvas_local;
  
  if (buffer != (nk_buffer *)0x0) {
    if (((buffer == (nk_buffer *)0x0) || (buffer->size == 0)) || (canvas->cmd_count == 0)) {
      canvas_local = (nk_draw_list *)0x0;
    }
    else {
      canvas_local = (nk_draw_list *)
                     ((long)(buffer->memory).ptr + ((buffer->memory).size - canvas->cmd_offset));
    }
    return (nk_draw_command *)canvas_local;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x2434,
                "const struct nk_draw_command *nk__draw_list_begin(const struct nk_draw_list *, const struct nk_buffer *)"
               );
}

Assistant:

NK_API const struct nk_draw_command*
nk__draw_list_begin(const struct nk_draw_list *canvas, const struct nk_buffer *buffer)
{
    nk_byte *memory;
    nk_size offset;
    const struct nk_draw_command *cmd;

    NK_ASSERT(buffer);
    if (!buffer || !buffer->size || !canvas->cmd_count)
        return 0;

    memory = (nk_byte*)buffer->memory.ptr;
    offset = buffer->memory.size - canvas->cmd_offset;
    cmd = nk_ptr_add(const struct nk_draw_command, memory, offset);
    return cmd;
}